

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Random_keys.cpp
# Opt level: O2

void __thiscall
Random_keys::cruzamento4
          (Random_keys *this,RK_Individual *pai1,RK_Individual *pai2,RK_Individual *filho)

{
  double dVar1;
  double dVar2;
  double *pdVar3;
  pointer __first;
  pointer __last;
  ulong uVar4;
  reference ppCVar5;
  unsigned_long i_1;
  RK_Individual *pRVar6;
  unsigned_long i;
  size_type __n;
  double dVar7;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> local_38;
  
  __last = RK_Individual::cromossomos.
           super__Vector_base<Chromosome_*,_std::allocator<Chromosome_*>_>._M_impl.
           super__Vector_impl_data._M_finish;
  __first = RK_Individual::cromossomos.
            super__Vector_base<Chromosome_*,_std::allocator<Chromosome_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  __n = 0;
  uVar4 = time((time_t *)0x0);
  local_38._M_x = uVar4 % 0x7fffffff + (ulong)(uVar4 % 0x7fffffff == 0);
  std::
  shuffle<__gnu_cxx::__normal_iterator<Chromosome**,std::vector<Chromosome*,std::allocator<Chromosome*>>>,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
            ((__normal_iterator<Chromosome_**,_std::vector<Chromosome_*,_std::allocator<Chromosome_*>_>_>
              )__first,
             (__normal_iterator<Chromosome_**,_std::vector<Chromosome_*,_std::allocator<Chromosome_*>_>_>
              )__last,&local_38);
  dVar7 = round((double)(int)((ulong)((long)RK_Individual::cromossomos.
                                            super__Vector_base<Chromosome_*,_std::allocator<Chromosome_*>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)RK_Individual::cromossomos.
                                           super__Vector_base<Chromosome_*,_std::allocator<Chromosome_*>_>
                                           ._M_impl.super__Vector_impl_data._M_start) >> 3) * 0.8);
  dVar1 = pai1->active_loss;
  dVar2 = pai2->active_loss;
  pRVar6 = pai2;
  if (dVar1 < dVar2) {
    pRVar6 = pai1;
  }
  uVar4 = (ulong)(int)dVar7;
  for (; uVar4 != __n; __n = __n + 1) {
    pdVar3 = pRVar6->weights;
    ppCVar5 = std::vector<Chromosome_*,_std::allocator<Chromosome_*>_>::at
                        (&RK_Individual::cromossomos,__n);
    dVar7 = pdVar3[(*ppCVar5)->position];
    pdVar3 = filho->weights;
    ppCVar5 = std::vector<Chromosome_*,_std::allocator<Chromosome_*>_>::at
                        (&RK_Individual::cromossomos,__n);
    pdVar3[(*ppCVar5)->position] = dVar7;
  }
  if (dVar1 < dVar2) {
    pai1 = pai2;
  }
  while( true ) {
    if ((ulong)((long)RK_Individual::cromossomos.
                      super__Vector_base<Chromosome_*,_std::allocator<Chromosome_*>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)RK_Individual::cromossomos.
                      super__Vector_base<Chromosome_*,_std::allocator<Chromosome_*>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3) <= uVar4) break;
    pdVar3 = pai1->weights;
    ppCVar5 = std::vector<Chromosome_*,_std::allocator<Chromosome_*>_>::at
                        (&RK_Individual::cromossomos,uVar4);
    dVar1 = pdVar3[(*ppCVar5)->position];
    pdVar3 = filho->weights;
    ppCVar5 = std::vector<Chromosome_*,_std::allocator<Chromosome_*>_>::at
                        (&RK_Individual::cromossomos,uVar4);
    pdVar3[(*ppCVar5)->position] = dVar1;
    uVar4 = uVar4 + 1;
  }
  return;
}

Assistant:

void Random_keys::cruzamento4(RK_Individual *pai1, RK_Individual *pai2, RK_Individual *filho) {
    shuffle(RK_Individual::cromossomos.begin(), RK_Individual::cromossomos.end(), std::default_random_engine(time(NULL)));

    int tam = RK_Individual::cromossomos.size();

    int tamMelhor = round(0.8*tam);

    RK_Individual *melhorPai = pai2, *piorPai = pai1;
    if(pai1->getActiveLoss()<pai2->getActiveLoss()){
        melhorPai = pai1;
        piorPai = pai2;
    }

    //80% vem do melhor pai
    for(unsigned long int i=0; i<tamMelhor; i++)
        filho->getWeights()[RK_Individual::cromossomos.at(i)->position] = melhorPai->getWeights()[RK_Individual::cromossomos.at(i)->position];

    //20% vem do pior pai
    for(unsigned long int i=tamMelhor; i<RK_Individual::cromossomos.size(); i++)
        filho->getWeights()[RK_Individual::cromossomos.at(i)->position] = piorPai->getWeights()[RK_Individual::cromossomos.at(i)->position];
}